

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O1

RK_S32 mpp_hevc_output_frame(void *ctx,int flush)

{
  byte bVar1;
  HEVCContext *s_00;
  long lVar2;
  HEVCSPS *pHVar3;
  bool bVar4;
  bool bVar5;
  RK_S32 RVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  HEVCContext *s;
  RK_U8 *pRVar11;
  ulong uVar12;
  RK_S32 unaff_R13D;
  HEVCFrame *pHVar13;
  long lVar14;
  HEVCFrame *pHVar15;
  
  s_00 = *ctx;
  lVar2 = *(long *)((long)ctx + 0x50);
  if (*(int *)(lVar2 + 0x1c) == 0) {
    do {
      iVar7 = 0x7fffffff;
      uVar12 = 0;
      uVar9 = 0;
      iVar10 = 0;
      pRVar11 = &s_00->DPB[0].flags;
      do {
        if (((*pRVar11 & 1) != 0) && (*(RK_U16 *)(pRVar11 + -2) == s_00->seq_output)) {
          iVar10 = iVar10 + 1;
          if (*(int *)(pRVar11 + -0x1e) < iVar7) {
            uVar9 = uVar12 & 0xffffffff;
            iVar7 = *(int *)(pRVar11 + -0x1e);
          }
        }
        uVar12 = uVar12 + 1;
        pRVar11 = pRVar11 + 0x40;
      } while (uVar12 != 0x11);
      if ((((flush == 0) && (s_00->seq_output == s_00->seq_decode)) &&
          (pHVar3 = s_00->sps, pHVar3 != (HEVCSPS *)0x0)) &&
         (iVar10 <= pHVar3->temporal_layer[(long)pHVar3->max_sub_layers + -1].num_reorder_pics)) {
        iVar7 = 1;
        RVar6 = 0;
        if (*(int *)(lVar2 + 0x38) != 0) {
          if ((uint)(s_00->nal_unit_type + ~(NAL_RASL_N|NAL_RADL_R)) < 3) {
            if (s_00->first_i_fast_play == 0) {
LAB_0019db6e:
              s_00->first_i_fast_play = 1;
              goto LAB_0019db78;
            }
          }
          else {
            RVar6 = 0;
            if ((uint)(s_00->nal_unit_type + ~NAL_BLA_N_LP) < 2) goto LAB_0019db6e;
          }
        }
      }
      else {
LAB_0019db78:
        if (iVar10 == 0) {
          iVar7 = 2;
          RVar6 = unaff_R13D;
          if (s_00->seq_output != s_00->seq_decode) {
            s_00->seq_output = s_00->seq_output + 1 & 0xff;
            iVar7 = 0;
          }
        }
        else {
          iVar7 = (int)uVar9;
          pRVar11 = &s_00->DPB[iVar7].flags;
          *pRVar11 = *pRVar11 & 0xfe;
          pHVar15 = s_00->DPB + iVar7;
          s_00->output_frame_idx = (RK_U8)uVar9;
          mpp_buf_slot_set_flag(s_00->slots,s_00->DPB[iVar7].slot_index,SLOT_QUEUE_USE);
          mpp_buf_slot_enqueue(s_00->slots,s_00->DPB[iVar7].slot_index,QUEUE_DISPLAY);
          if (((byte)h265d_debug & 0x80) != 0) {
            _mpp_log_l(4,"H265D_PARSER","Output frame with POC %d frame->slot_index = %d\n",
                       (char *)0x0,(ulong)(uint)pHVar15->poc,(ulong)(uint)pHVar15->slot_index);
          }
          uVar9 = 0;
          bVar5 = false;
          do {
            do {
              bVar4 = bVar5;
              uVar8 = (uint)uVar9;
              bVar1 = s_00->DPB[uVar9].flags;
              if ((((bVar1 & 1) != 0) &&
                  (pHVar13 = s_00->DPB + uVar9, pHVar13->sequence == s_00->seq_output)) &&
                 (pHVar13->poc == pHVar15->poc + 1)) {
                s_00->output_frame_idx = (RK_U8)uVar9;
                pHVar13->flags = bVar1 & 0xfe;
                mpp_buf_slot_set_flag(s_00->slots,pHVar13->slot_index,SLOT_QUEUE_USE);
                mpp_buf_slot_enqueue(s_00->slots,pHVar13->slot_index,QUEUE_DISPLAY);
                if (((byte)h265d_debug & 0x80) != 0) {
                  _mpp_log_l(4,"H265D_PARSER",
                             "Output frame with POC %d frm_next_ready->slot_index = %d\n",
                             (char *)0x0,(ulong)(uint)pHVar13->poc,(ulong)(uint)pHVar13->slot_index)
                  ;
                }
                lVar14 = 0xcd0;
                do {
                  mpp_hevc_unref_frame(s_00,(HEVCFrame *)((long)s_00->vps_list + lVar14 + -0x30),0);
                  lVar14 = lVar14 + 0x40;
                } while (lVar14 != 0x1110);
                bVar4 = true;
                uVar8 = 0x11;
                pHVar15 = pHVar13;
              }
              uVar9 = (ulong)(uVar8 + 1);
              bVar5 = bVar4;
            } while (uVar8 < 0x10);
            uVar9 = 0;
            bVar5 = false;
          } while (bVar4);
          iVar7 = 1;
          RVar6 = 1;
        }
      }
      unaff_R13D = RVar6;
    } while (iVar7 == 0);
    if (iVar7 == 2) {
      unaff_R13D = 0;
    }
  }
  else {
    pHVar15 = s_00->ref;
    unaff_R13D = 0;
    if ((pHVar15 != (HEVCFrame *)0x0) && ((pHVar15->flags & 1) != 0)) {
      pHVar15->flags = pHVar15->flags & 0xfe;
      mpp_buf_slot_set_flag(s_00->slots,pHVar15->slot_index,SLOT_QUEUE_USE);
      mpp_buf_slot_enqueue(s_00->slots,s_00->ref->slot_index,QUEUE_DISPLAY);
    }
  }
  return unaff_R13D;
}

Assistant:

static RK_S32 mpp_hevc_output_frame(void *ctx, int flush)
{

    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    HEVCContext *s = (HEVCContext *)h265dctx->priv_data;
    MppDecCfgSet *cfg = h265dctx->cfg;
    RK_U32 find_next_ready = 0;

    if (cfg->base.fast_out)
        return mpp_hevc_out_dec_order(ctx);

    do {
        RK_S32 nb_output = 0;
        RK_S32 min_poc   = INT_MAX;
        RK_S32 min_idx = 0;
        RK_U32 i;

        for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
            HEVCFrame *frame = &s->DPB[i];
            if ((frame->flags & HEVC_FRAME_FLAG_OUTPUT) &&
                frame->sequence == s->seq_output) {
                nb_output++;
                if (frame->poc < min_poc) {
                    min_poc = frame->poc;
                    min_idx = i;
                }
            }
        }

        /* wait for more frames before output */
        if (!flush && s->seq_output == s->seq_decode && s->sps &&
            nb_output <= s->sps->temporal_layer[s->sps->max_sub_layers - 1].num_reorder_pics) {
            if (cfg->base.enable_fast_play && (IS_IDR(s) ||
                                               (IS_BLA(s) && !s->first_i_fast_play))) {
                s->first_i_fast_play = 1;
            } else {
                return 0;
            }
        }

        if (nb_output) {
            HEVCFrame *frame = &s->DPB[min_idx];

            frame->flags &= ~(HEVC_FRAME_FLAG_OUTPUT);
            s->output_frame_idx = min_idx;

            mpp_buf_slot_set_flag(s->slots, frame->slot_index, SLOT_QUEUE_USE);
            mpp_buf_slot_enqueue(s->slots, frame->slot_index, QUEUE_DISPLAY);

            h265d_dbg(H265D_DBG_REF,
                      "Output frame with POC %d frame->slot_index = %d\n", frame->poc, frame->slot_index);

            do {
                find_next_ready = 0;
                for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
                    HEVCFrame *frame_next_ready = &s->DPB[i];
                    if ((frame_next_ready->flags & HEVC_FRAME_FLAG_OUTPUT) &&
                        frame_next_ready->sequence == s->seq_output) {
                        if (frame_next_ready->poc == frame->poc + 1) {
                            find_next_ready = 1;
                            s->output_frame_idx = i;
                            frame_next_ready->flags &= ~(HEVC_FRAME_FLAG_OUTPUT);
                            frame = frame_next_ready;
                            mpp_buf_slot_set_flag(s->slots, frame->slot_index, SLOT_QUEUE_USE);
                            mpp_buf_slot_enqueue(s->slots, frame->slot_index, QUEUE_DISPLAY);
                            h265d_dbg(H265D_DBG_REF,
                                      "Output frame with POC %d frm_next_ready->slot_index = %d\n",
                                      frame_next_ready->poc, frame_next_ready->slot_index);
                            /* release any frames that are now unused */
                            for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
                                mpp_hevc_unref_frame(s, &s->DPB[i], 0);
                            }
                        }
                    }
                }
            } while (find_next_ready);

            return 1;
        }

        if (s->seq_output != s->seq_decode)
            s->seq_output = (s->seq_output + 1) & 0xff;
        else
            break;
    } while (1);

    return 0;
}